

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

void __thiscall
TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::~TPZFrontMatrix(TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                  *this)

{
  ~TPZFrontMatrix(this,&TPZFrontMatrix<std::complex<float>,TPZFileEqnStorage<std::complex<float>>,TPZFrontSym<std::complex<float>>>
                        ::VTT);
  operator_delete(this,0x250);
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}